

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::dropEvent(QAbstractItemView *this,QDropEvent *event)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  DragDropMode DVar4;
  QAbstractItemView *pQVar5;
  int iVar6;
  long in_FS_OFFSET;
  int row;
  int col;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(this + 8);
  DVar4 = dragDropMode(this);
  if (DVar4 == InternalMove) {
    pQVar5 = (QAbstractItemView *)QDropEvent::source();
    if ((pQVar5 != this) || (((byte)event[0x28] & 2) == 0)) goto LAB_0053f1f1;
  }
  local_48 = 0xffffffffffffffff;
  uStack_40 = 0;
  local_38 = 0;
  cVar3 = (**(code **)(*plVar1 + 0x110))(plVar1,event);
  if (cVar3 != '\0') {
    DVar4 = dragDropMode(this);
    iVar6 = 2;
    if (DVar4 != InternalMove) {
      iVar6 = *(int *)(event + 0x2c);
    }
    cVar3 = (**(code **)(*(long *)plVar1[0x5f] + 0xe0))
                      ((long *)plVar1[0x5f],*(undefined8 *)(event + 0x38),iVar6,0xffffffff,
                       0xffffffff,&local_48);
    if (cVar3 != '\0') {
      if (iVar6 == *(int *)(event + 0x2c)) {
        *(undefined4 *)(event + 0x2c) = *(undefined4 *)(event + 0x30);
      }
      else {
        QDropEvent::setDropAction((DropAction)event);
      }
      event[0xc] = (QDropEvent)0x1;
    }
  }
  lVar2 = *(long *)(this + 8);
  QBasicTimer::stop();
  *(undefined4 *)(lVar2 + 0x424) = 0;
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  QWidget::update((QWidget *)plVar1[0x56]);
LAB_0053f1f1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dropEvent(QDropEvent *event)
{
    Q_D(QAbstractItemView);
    if (dragDropMode() == InternalMove) {
        if (event->source() != this || !(event->possibleActions() & Qt::MoveAction))
            return;
    }

    QModelIndex index;
    int col = -1;
    int row = -1;
    if (d->dropOn(event, &row, &col, &index)) {
        const Qt::DropAction action = dragDropMode() == InternalMove ? Qt::MoveAction : event->dropAction();
        if (d->model->dropMimeData(event->mimeData(), action, row, col, index)) {
            if (action != event->dropAction()) {
                event->setDropAction(action);
                event->accept();
            } else {
                event->acceptProposedAction();
            }
        }
    }
    stopAutoScroll();
    setState(NoState);
    d->viewport->update();
}